

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::VarintErrorCasesWithSizes_ReadVarint64Error_Test::TestBody
          (VarintErrorCasesWithSizes_ReadVarint64Error_Test *this)

{
  int block_size;
  size_t sVar1;
  ParamType *pPVar2;
  pointer *__ptr;
  char *message;
  pair<unsigned_long,_bool> pVar3;
  AssertionResult gtest_ar;
  CodedInputStream coded_input;
  VarintErrorCase kVarintErrorCases_case;
  ArrayInputStream input;
  Message local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  CodedInputStream local_b8;
  undefined8 local_68;
  undefined8 uStack_60;
  size_t local_58;
  undefined8 uStack_50;
  char *local_48;
  ArrayInputStream local_40;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
           ::GetParam();
  local_68 = *(undefined8 *)
              (pPVar2->
              super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
              ).
              super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>
              ._M_head_impl.bytes;
  uStack_60 = *(undefined8 *)
               ((pPVar2->
                super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
                ).
                super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>
                ._M_head_impl.bytes + 8);
  local_58 = (pPVar2->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
             ).
             super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>
             ._M_head_impl.size;
  uStack_50 = *(undefined8 *)
               &(pPVar2->
                super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
                ).
                super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>
                ._M_head_impl.can_parse;
  local_48 = (pPVar2->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
             ).
             super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_false>
             ._M_head_impl.name;
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
           ::GetParam();
  sVar1 = local_58;
  block_size = (pPVar2->
               super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>
               ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  memcpy(&io::(anonymous_namespace)::CodedStreamTest::buffer_,&local_68,local_58);
  ArrayInputStream::ArrayInputStream
            (&local_40,&io::(anonymous_namespace)::CodedStreamTest::buffer_,(int)sVar1,block_size);
  local_b8.buffer_ = (uint8_t *)0x0;
  local_b8.buffer_end_ = (uint8_t *)0x0;
  local_b8._24_7_ = 0;
  local_b8.overflow_bytes_._3_1_ = 0;
  local_b8.last_tag_ = 0;
  local_b8.legitimate_message_end_ = false;
  local_b8.aliasing_enabled_ = false;
  local_b8.force_eager_parsing_ = false;
  local_b8.current_limit_ = 0x7fffffff;
  local_b8.buffer_size_after_limit_ = 0;
  local_b8.total_bytes_limit_ = 0x7fffffff;
  local_b8.recursion_budget_ = CodedInputStream::default_recursion_limit_;
  local_b8.recursion_limit_ = CodedInputStream::default_recursion_limit_;
  local_b8.extension_pool_ = (DescriptorPool *)0x0;
  local_b8.extension_factory_ = (MessageFactory *)0x0;
  local_b8.input_ = &local_40.super_ZeroCopyInputStream;
  CodedInputStream::Refresh(&local_b8);
  if ((local_b8.buffer_ < local_b8.buffer_end_) && (-1 < (char)*local_b8.buffer_)) {
    local_b8.buffer_ = local_b8.buffer_ + 1;
    local_d8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = 1;
  }
  else {
    pVar3 = CodedInputStream::ReadVarint64Fallback(&local_b8);
    local_d8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = pVar3.second & 1;
  }
  testing::internal::CmpHelperEQ<bool,bool>
            (local_c8,"kVarintErrorCases_case.can_parse","coded_input.ReadVarint64(&value)",
             (bool *)&uStack_50,(bool *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message(&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x1ad,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)CONCAT71(local_d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         (byte)local_d8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     (byte)local_d8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  CodedInputStream::~CodedInputStream(&local_b8);
  return;
}

Assistant:

TEST_P(VarintErrorCasesWithSizes, ReadVarint64Error) {
  VarintErrorCase kVarintErrorCases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintErrorCases_case.bytes, kVarintErrorCases_case.size);
  ArrayInputStream input(buffer_, static_cast<int>(kVarintErrorCases_case.size),
                         kBlockSizes_case);
  CodedInputStream coded_input(&input);

  uint64_t value;
  EXPECT_EQ(kVarintErrorCases_case.can_parse, coded_input.ReadVarint64(&value));
}